

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# erfunc.c
# Opt level: O3

double erfinv(double x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar3 = ABS(x);
  if (1.0 < dVar3) {
    printf("The Input takes values between -1 and +1");
    exit(1);
  }
  if (dVar3 <= 0.75) {
    dVar1 = x * x + -0.5625;
    dVar2 = (((dVar1 * 0.236997019142 + -5.4309342907266) * dVar1 + 17.6230176190819) * dVar1 +
            -16.6805947126248) * dVar1 + 4.62680202125696;
    dVar1 = (((dVar1 + -9.9016863476727) * dVar1 + 22.7331464544494) * dVar1 + -17.5930726990431) *
            dVar1 + 4.26606447606664;
  }
  else {
    if ((dVar3 <= 0.75) || (0.9375 < dVar3)) {
      dVar1 = *(double *)(&DAT_00155760 + (ulong)(0.0 < x) * 8);
      if ((dVar3 <= 0.9375) || (1.0 <= dVar3)) {
        dVar1 = dVar1 * 1.79e+308;
      }
      else {
        dVar2 = log(1.0 - dVar3);
        if (-0.0 < dVar2) {
          dVar2 = sqrt(-dVar2);
        }
        else {
          dVar2 = SQRT(-dVar2);
        }
        dVar2 = 1.0 / dVar2;
        dVar1 = (dVar1 * ((((dVar2 * -0.16444156791 + 0.680544246825) * dVar2 + -1.128081391617) *
                           dVar2 + 0.690969348887) * dVar2 +
                         0.1550470003116 / dVar2 + 1.382719649631)) /
                ((dVar2 + 1.385228141995) * dVar2 + 0.155024849822);
      }
      goto LAB_0013cfb3;
    }
    dVar1 = x * x + -0.87890625;
    dVar2 = ((((dVar1 * 0.302601149432 + -3.65953596495117) * dVar1 + 6.24518431579026) * dVar1 +
             -3.28902674093993) * dVar1 + 0.643729854003468) * dVar1 + -0.041199817067782;
    dVar1 = ((((dVar1 + -5.40640580412825) * dVar1 + 6.65393051963183) * dVar1 + -2.90144687299145)
             * dVar1 + 0.501148500527886) * dVar1 + -0.029324540620124;
  }
  dVar1 = (dVar2 * x) / dVar1;
LAB_0013cfb3:
  if (dVar3 < 1.0) {
    dVar3 = erf__(dVar1);
    dVar2 = exp(-dVar1 * dVar1);
    dVar3 = (dVar3 - x) / (dVar2 * 1.1283791670955126);
    dVar1 = dVar1 - dVar3 / (dVar3 * dVar1 + 1.0);
  }
  return dVar1;
}

Assistant:

double erfinv(double x) {
	double a,t,oup,num,den,xinf,sign,temp,pi;
	/*
	 * This implementation is based on 
	 * J. M. Blair, C. A. Edwards, and J. H. Johnson, "Rational
	Chebyshev Approximations for the Inverse of the Error Function",
	Mathematics of Computation, 30 (1976) 827-830 
	* 
	* Tables from www.jstor.org's copy of the paper are used in this
	 * implementation.
	 */ 
	 if ( x > 0.0) {
		 sign = 1.0; 
	} else {
		 sign = -1.0;	 
	}
	 a = fabs(x);
	 xinf = 1.79e308;
	 pi  = 3.1415926535897932384626434;
	 
	 if (a > 1.) {
		 printf("The Input takes values between -1 and +1");
		 exit(1);
	 }
	 
	 if (a <= 0.75) {
		 //Coefficients from table 13
		 double p[5] = {4.62680202125696,-16.6805947126248,17.6230176190819,\
			 -5.4309342907266,0.236997019142};
		 double q[5] = {4.26606447606664,-17.5930726990431,22.7331464544494,\
			 -9.9016863476727,1.000000000000};
		 
		 t = x*x - 0.75*0.75;
		 num = p[0] + t * ( p[1] + t * ( p[2] + t * ( p[3] + t * p[4]))); 
		 den = q[0] + t * ( q[1] + t * ( q[2] + t * ( q[3] + t * q[4]))); 
		 oup = x * num / den;
		 
	 } else if ( 0.75 < a && a <= 0.9375) {
		 //Coefficients from table 33
		 double p[6] = {-0.041199817067782,0.643729854003468,-3.28902674093993,\
			6.24518431579026,-3.65953596495117,0.30260114943200};
		 double q[6] = {-0.029324540620124,0.501148500527886,-2.90144687299145,\
			 6.65393051963183,-5.40640580412825,1.0000000000000};
		 
		 t = x*x - 0.9375*0.9375;
		 num = p[0] + t * ( p[1] + t * ( p[2] + t * ( p[3] + t * (p[4] + t * p[5])))); 
		 den = q[0] + t * ( q[1] + t * ( q[2] + t * ( q[3] + t * (q[4] + t * q[5])))); 
		 oup = x * num / den;	 
	 } else if ( 0.9375 < a && a  < 1.) {
		 //Coefficients from table 53
		 /*double p[7] = {0.00479447793346489,0.17121766901388401,1.26186520719596240,\
			 2.1339060556433715,0.2838737490019514,0.2353035904898929,\
			 -0.0400763898644416};
		 double q[6] = {0.00479437046609729,0.17124542554915192,1.27422170654959402,\
			 2.4161883799488509,1.4957337483050566,1.0000000000000000};
			 
		 t=1.0/sqrt(-log(1.0-a));
		 num = p[0] + t * ( p[1] + t * ( p[2] + t * ( p[3] + t * ( p[4] + t * ( p[5] + t * ( p[6] + t * p[7]))))));	 
		 den = q[0] + t * ( q[1] + t * ( q[2] + t * ( q[3] + t * (q[4] + t * ( q[5] + t * q[6]))))); 
		 oup = sign * num / (den * t);	
		 * */
		 
		//Coefficients from table 50 as these are more accurate
		double p[6] = {.1550470003116,1.382719649631,.690969348887, \
			-1.128081391617, .680544246825,-.16444156791};
		double q[3] = {.155024849822,1.385228141995,1.000000000000}; 
		
		t=1.0/sqrt(-log(1.0-a));
		oup = sign*(p[0]/t+p[1]+t*(p[2]+t*(p[3]+t*(p[4]+t*p[5]))))/
          (q[0]+t*(q[1]+t*(q[2])));
	 } else {
		 oup = sign * xinf;
	 } 
	 
	 // Apply Newton's correction and Halley's step
	 
	 if (a < 1.) {
		 temp = (erf(oup) - x) / ( 2 / sqrt(pi) * exp(- pow(oup,2.0)));
		 oup -= temp / ( 1 + temp*oup);
	 }
	 
	return oup;
}